

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O3

TablePartitionInfo __thiscall
duckdb::MultiFileReader::GetPartitionInfo
          (MultiFileReader *this,ClientContext *context,MultiFileReaderBindData *bind_data,
          TableFunctionPartitionInput *input)

{
  pointer puVar1;
  pointer pHVar2;
  pointer pHVar3;
  unsigned_long *partition_col;
  pointer puVar4;
  HivePartitioningIndex *partition;
  pointer pHVar5;
  
  puVar4 = (input->partition_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (input->partition_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 == puVar1) {
    return SINGLE_VALUE_PARTITIONS;
  }
  pHVar2 = (bind_data->hive_partitioning_indexes).
           super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
           .
           super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar3 = (bind_data->hive_partitioning_indexes).
           super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
           .
           super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pHVar2 == pHVar3) break;
    pHVar5 = pHVar2;
    while (pHVar5->index != *puVar4) {
      pHVar5 = pHVar5 + 1;
      if (pHVar5 == pHVar3) {
        return NOT_PARTITIONED;
      }
    }
    puVar4 = puVar4 + 1;
  } while (puVar4 != puVar1);
  return pHVar2 != pHVar3;
}

Assistant:

TablePartitionInfo MultiFileReader::GetPartitionInfo(ClientContext &context, const MultiFileReaderBindData &bind_data,
                                                     TableFunctionPartitionInput &input) {
	// check if all of the columns are in the hive partition set
	for (auto &partition_col : input.partition_ids) {
		// check if this column is in the hive partitioned set
		bool found = false;
		for (auto &partition : bind_data.hive_partitioning_indexes) {
			if (partition.index == partition_col) {
				found = true;
				break;
			}
		}
		if (!found) {
			// the column is not partitioned - hive partitioning alone can't guarantee the groups are partitioned
			return TablePartitionInfo::NOT_PARTITIONED;
		}
	}
	// if all columns are in the hive partitioning set, we know that each partition will only have a single value
	// i.e. if the hive partitioning is by (YEAR, MONTH), each partition will have a single unique (YEAR, MONTH)
	return TablePartitionInfo::SINGLE_VALUE_PARTITIONS;
}